

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidgetPrivate::setup(QListWidgetPrivate *this)

{
  long lVar1;
  array<QMetaObject::Connection,_8UL> *paVar2;
  array<QMetaObject::Connection,_8UL> *this_00;
  QListWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QListWidget *q;
  QListWidget *in_stack_fffffffffffffe68;
  QListModel *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffec0;
  ConnectionType CVar3;
  Object *in_stack_fffffffffffffec8;
  code *receiverPrivate;
  Object *in_stack_fffffffffffffed0;
  Object *sender;
  Function in_stack_fffffffffffffef0;
  Function slot;
  offset_in_QAbstractItemView_to_subr in_stack_ffffffffffffff00;
  offset_in_QAbstractItemModel_to_subr signal;
  QAbstractItemModel *in_stack_ffffffffffffffc8;
  QAbstractItemView *in_stack_ffffffffffffffd0;
  
  CVar3 = (ConnectionType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = (array<QMetaObject::Connection,_8UL> *)q_func(in_RDI);
  this_00 = (array<QMetaObject::Connection,_8UL> *)operator_new(0x40);
  QListModel::QListModel(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  QAbstractItemView::setModel(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffed0,in_stack_ffffffffffffff00,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffef0,CVar3);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffed0,in_stack_ffffffffffffff00,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffef0,CVar3);
  signal = 0;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffed0,0,in_stack_fffffffffffffec8,in_stack_fffffffffffffef0,CVar3);
  slot = 0;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffed0,signal,in_stack_fffffffffffffec8,0,CVar3);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffed0,signal,in_stack_fffffffffffffec8,slot,CVar3);
  receiverPrivate = QAbstractItemModel::dataChanged;
  sender = (Object *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QListWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)0x0,signal,(Object *)QAbstractItemModel::dataChanged,slot,CVar3);
  CVar3 = AutoConnection;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QListWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (sender,signal,(Object *)receiverPrivate,slot,AutoConnection);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QListWidgetPrivate::*)()>
            (sender,signal,(Object *)receiverPrivate,slot,CVar3);
  std::array<QMetaObject::Connection,_8UL>::operator=(this_00,paVar2);
  std::array<QMetaObject::Connection,_8UL>::~array(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::setup()
{
    Q_Q(QListWidget);
    q->QListView::setModel(new QListModel(q));
    // view signals
    connections = {
        QObjectPrivate::connect(q, &QListWidget::pressed,
                                this, &QListWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(q, &QListWidget::clicked,
                                this, &QListWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(q, &QListWidget::doubleClicked,
                                this, &QListWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(q, &QListWidget::activated,
                                this, &QListWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(q, &QListWidget::entered,
                                this, &QListWidgetPrivate::emitItemEntered),
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QListWidgetPrivate::emitItemChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QListWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::columnsRemoved,
                                this, &QListWidgetPrivate::sort)
    };
}